

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_helpers.cc
# Opt level: O2

char * google::protobuf::compiler::cxx::PrimitiveTypeName(CppType type)

{
  LogMessage *other;
  char *pcVar1;
  LogFinisher local_41;
  LogMessage local_40;
  
  if (type - CPPTYPE_INT32 < 10) {
    pcVar1 = (&PTR_anon_var_dwarf_8436f_00297280)[type - CPPTYPE_INT32];
  }
  else {
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/cxx25x/cxx_helpers.cc"
               ,0xe1);
    other = internal::LogMessage::operator<<(&local_40,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_41,other);
    internal::LogMessage::~LogMessage(&local_40);
    pcVar1 = (char *)0x0;
  }
  return pcVar1;
}

Assistant:

const char* PrimitiveTypeName(FieldDescriptor::CppType type) {
  switch (type) {
    case FieldDescriptor::CPPTYPE_INT32  : return "::google::protobuf::int32";
    case FieldDescriptor::CPPTYPE_INT64  : return "::google::protobuf::int64";
    case FieldDescriptor::CPPTYPE_UINT32 : return "::google::protobuf::uint32";
    case FieldDescriptor::CPPTYPE_UINT64 : return "::google::protobuf::uint64";
    case FieldDescriptor::CPPTYPE_DOUBLE : return "double";
    case FieldDescriptor::CPPTYPE_FLOAT  : return "float";
    case FieldDescriptor::CPPTYPE_BOOL   : return "bool";
    case FieldDescriptor::CPPTYPE_ENUM   : return "int";
    case FieldDescriptor::CPPTYPE_STRING : return "::std::string";
    case FieldDescriptor::CPPTYPE_MESSAGE: return NULL;

    // No default because we want the compiler to complain if any new
    // CxxTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}